

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

uint llvm::dwarf::AttributeEncodingVersion(TypeKind ATE)

{
  uint local_c;
  TypeKind ATE_local;
  
  switch(ATE) {
  case DW_ATE_address:
    local_c = 2;
    break;
  case DW_ATE_boolean:
    local_c = 2;
    break;
  case DW_ATE_complex_float:
    local_c = 2;
    break;
  case DW_ATE_float:
    local_c = 2;
    break;
  case DW_ATE_signed:
    local_c = 2;
    break;
  case DW_ATE_signed_char:
    local_c = 2;
    break;
  case DW_ATE_unsigned:
    local_c = 2;
    break;
  case DW_ATE_unsigned_char:
    local_c = 2;
    break;
  case DW_ATE_imaginary_float:
    local_c = 3;
    break;
  case DW_ATE_packed_decimal:
    local_c = 3;
    break;
  case DW_ATE_numeric_string:
    local_c = 3;
    break;
  case DW_ATE_edited:
    local_c = 3;
    break;
  case DW_ATE_signed_fixed:
    local_c = 3;
    break;
  case DW_ATE_unsigned_fixed:
    local_c = 3;
    break;
  case DW_ATE_decimal_float:
    local_c = 3;
    break;
  case DW_ATE_UTF:
    local_c = 4;
    break;
  case DW_ATE_UCS:
    local_c = 5;
    break;
  case DW_ATE_ASCII:
    local_c = 5;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

unsigned llvm::dwarf::AttributeEncodingVersion(dwarf::TypeKind ATE) {
  switch (ATE) {
  default:
    return 0;
#define HANDLE_DW_ATE(ID, NAME, VERSION, VENDOR)                               \
  case DW_ATE_##NAME:                                                          \
    return VERSION;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}